

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::SliceStaticLayerParams::ByteSizeLong(SliceStaticLayerParams *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  size_t sVar9;
  int iVar10;
  
  uVar3 = (this->beginids_).current_size_;
  uVar5 = 0;
  if ((int)uVar3 < 1) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    do {
      puVar4 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->beginids_,(int)uVar5);
      lVar7 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      lVar6 = lVar6 + (ulong)((int)lVar7 * 9 + 0x49U >> 6);
      uVar8 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar8;
    } while (uVar3 != uVar8);
    if (lVar6 == 0) {
      lVar6 = 0;
      uVar5 = 0;
    }
    else if ((int)(uint)lVar6 < 0) {
      uVar5 = 0xb;
    }
    else {
      uVar3 = (uint)lVar6 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_beginids_cached_byte_size_ = (int)lVar6;
  lVar6 = uVar5 + lVar6;
  uVar3 = (this->beginmasks_).current_size_;
  if ((ulong)uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    lVar6 = lVar6 + uVar5;
  }
  this->_beginmasks_cached_byte_size_ = uVar3;
  lVar6 = lVar6 + (ulong)uVar3;
  iVar1 = (this->endids_).current_size_;
  iVar10 = 0;
  if (iVar1 < 1) {
LAB_004a8ee5:
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      puVar4 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->endids_,iVar10);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
    if (lVar7 == 0) goto LAB_004a8ee5;
    if ((int)(uint)lVar7 < 0) {
      uVar5 = 0xb;
    }
    else {
      uVar3 = (uint)lVar7 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    lVar6 = lVar6 + uVar5;
  }
  this->_endids_cached_byte_size_ = (int)lVar7;
  lVar6 = lVar6 + lVar7;
  uVar3 = (this->endmasks_).current_size_;
  if ((ulong)uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    lVar6 = lVar6 + uVar5;
  }
  this->_endmasks_cached_byte_size_ = uVar3;
  lVar6 = lVar6 + (ulong)uVar3;
  iVar1 = (this->strides_).current_size_;
  iVar10 = 0;
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      puVar4 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->strides_,iVar10);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
    if (lVar7 != 0) {
      if ((int)(uint)lVar7 < 0) {
        uVar5 = 0xb;
      }
      else {
        uVar3 = (uint)lVar7 | 1;
        iVar1 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
      }
      lVar6 = lVar6 + uVar5;
      goto LAB_004a8f90;
    }
  }
  lVar7 = 0;
LAB_004a8f90:
  this->_strides_cached_byte_size_ = (int)lVar7;
  lVar6 = lVar6 + lVar7;
  uVar3 = (this->squeezemasks_).current_size_;
  if ((ulong)uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    lVar6 = lVar6 + uVar5;
  }
  this->_squeezemasks_cached_byte_size_ = uVar3;
  sVar9 = lVar6 + (ulong)uVar3;
  this->_cached_size_ = (int)sVar9;
  return sVar9;
}

Assistant:

size_t SliceStaticLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SliceStaticLayerParams)
  size_t total_size = 0;

  // repeated int64 beginIds = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->beginids_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _beginids_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated bool beginMasks = 2;
  {
    unsigned int count = this->beginmasks_size();
    size_t data_size = 1UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _beginmasks_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int64 endIds = 3;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->endids_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _endids_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated bool endMasks = 4;
  {
    unsigned int count = this->endmasks_size();
    size_t data_size = 1UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _endmasks_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int64 strides = 5;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->strides_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _strides_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated bool squeezeMasks = 6;
  {
    unsigned int count = this->squeezemasks_size();
    size_t data_size = 1UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _squeezemasks_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}